

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O1

void update_sample(qsound_chip *chip)

{
  uint uVar1;
  qsound_delay *pqVar2;
  qsound_delay *pqVar3;
  ushort uVar4;
  int iVar5;
  UINT16 UVar6;
  int iVar7;
  short sVar8;
  INT16 IVar9;
  UINT16 UVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  UINT8 UVar14;
  ushort uVar15;
  int iVar16;
  INT16 (*paIVar17) [95];
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  INT16 IVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  INT16 *pIVar28;
  uint uVar29;
  INT16 *pIVar30;
  long lVar31;
  bool bVar32;
  
  uVar15 = chip->state;
  if (uVar15 < 0x314) {
    if (uVar15 == 0x39) {
      lVar31 = 0;
      do {
        *(undefined8 *)((long)chip->filter[0].taps + lVar31 + -10) = 0x5f;
        uVar15 = *(ushort *)((long)chip->filter[0].taps + lVar31 + -2);
        if ((uVar15 - 0xf2e & 0xffff) < 0xd1) {
          paIVar17 = (INT16 (*) [95])(qsound_filter_data2 + (uVar15 - 0xf2e));
        }
        else if ((ushort)(uVar15 - 0xcf5) < 0x239) {
          iVar7 = (uint)uVar15 + (int)((ulong)((long)(int)(uVar15 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar17 = qsound_filter_data + (uint)((iVar7 >> 6) - (iVar7 >> 0x1f));
        }
        else {
          paIVar17 = (INT16 (*) [95])0x0;
        }
        if (paIVar17 != (INT16 (*) [95])0x0) {
          memcpy((void *)((long)chip->filter[0].taps + lVar31),paIVar17,0xbe);
        }
        lVar31 = lVar31 + 0x188;
      } while (lVar31 == 0x188);
      chip->state = 0x314;
      chip->next_state = 0x314;
      return;
    }
    if (uVar15 == 0x4f) {
      lVar31 = 0;
      do {
        *(undefined8 *)((long)chip->filter[0].taps + lVar31 + -10) = 0x2d;
        uVar15 = *(ushort *)((long)chip->filter[0].taps + lVar31 + -2);
        if ((uVar15 - 0xf2e & 0xffff) < 0xd1) {
          paIVar17 = (INT16 (*) [95])(qsound_filter_data2 + (uVar15 - 0xf2e));
        }
        else if ((ushort)(uVar15 - 0xcf5) < 0x239) {
          iVar7 = (uint)uVar15 + (int)((ulong)((long)(int)(uVar15 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar17 = qsound_filter_data + (uint)((iVar7 >> 6) - (iVar7 >> 0x1f));
        }
        else {
          paIVar17 = (INT16 (*) [95])0x0;
        }
        if (paIVar17 != (INT16 (*) [95])0x0) {
          memcpy((void *)((long)chip->filter[0].taps + lVar31),paIVar17,0x5a);
        }
        *(undefined8 *)((long)chip->alt_filter[0].taps + lVar31 + -10) = 0x2c;
        uVar15 = *(ushort *)((long)chip->alt_filter[0].taps + lVar31 + -2);
        if ((uVar15 - 0xf2e & 0xffff) < 0xd1) {
          paIVar17 = (INT16 (*) [95])(qsound_filter_data2 + (uVar15 - 0xf2e));
        }
        else if ((ushort)(uVar15 - 0xcf5) < 0x239) {
          iVar7 = (uint)uVar15 + (int)((ulong)((long)(int)(uVar15 - 0xd53) * -0x53896e7b) >> 0x20) +
                  -0xd53;
          paIVar17 = qsound_filter_data + (uint)((iVar7 >> 6) - (iVar7 >> 0x1f));
        }
        else {
          paIVar17 = (INT16 (*) [95])0x0;
        }
        if (paIVar17 != (INT16 (*) [95])0x0) {
          memcpy((void *)((long)chip->alt_filter[0].taps + lVar31),paIVar17,0x58);
        }
        lVar31 = lVar31 + 0x188;
      } while (lVar31 == 0x188);
      chip->state = 0x6b2;
      chip->next_state = 0x6b2;
      return;
    }
  }
  else if ((uVar15 == 0x314) || (uVar15 == 0x6b2)) {
    sVar8 = -0x554;
    if (uVar15 == 0x6b2) {
      sVar8 = -0x53c;
    }
    chip->ready_flag = 0x80;
    sVar8 = sVar8 + (chip->echo).end_pos;
    lVar31 = 0;
    sVar11 = 0;
    if (0 < sVar8) {
      sVar11 = sVar8;
    }
    if (0x3ff < sVar11) {
      sVar11 = 0x400;
    }
    (chip->echo).length = sVar11;
    uVar19 = chip->muteMask;
    lVar25 = 0;
    iVar7 = 0;
    do {
      uVar27 = 0;
      if ((uVar19 >> ((uint)lVar25 & 0x1f) & 1) == 0) {
        uVar15 = *(ushort *)((long)&chip->voice[0].bank + lVar31);
        uVar4 = *(ushort *)((long)&chip->voice[0].addr + lVar31);
        if (((short)uVar15 < 0 && chip->romMask != 0) &&
           (uVar29 = chip->romMask & ((uVar15 & 0x7fff) << 0x10 | (uint)uVar4), uVar27 = 0,
           uVar29 < chip->romSize)) {
          uVar27 = (uint)(short)((ushort)chip->romData[uVar29] << 8);
        }
        uVar29 = (uint)(*(ushort *)((long)&chip->voice[0].phase + lVar31) >> 4) +
                 (uint)*(ushort *)((long)&chip->voice[0].rate + lVar31) + (short)uVar4 * 0x1000;
        if ((int)*(short *)((long)&chip->voice[0].end_addr + lVar31) <= (int)uVar29 >> 0xc) {
          uVar29 = uVar29 + *(short *)((long)&chip->voice[0].loop_len + lVar31) * -0x1000;
        }
        uVar27 = uVar27 * (int)*(short *)((long)&chip->voice[0].volume + lVar31) >> 0xe;
        iVar7 = iVar7 + (int)*(short *)((long)&chip->voice[0].echo + lVar31) * (int)(short)uVar27 *
                        4;
        if ((int)uVar29 < -0x7ffffff) {
          uVar29 = 0xf8000000;
        }
        if (0x7fffffe < (int)uVar29) {
          uVar29 = 0x7ffffff;
        }
        *(short *)((long)&chip->voice[0].addr + lVar31) = (short)(uVar29 >> 0xc);
        *(short *)((long)&chip->voice[0].phase + lVar31) = (short)(uVar29 << 4);
      }
      chip->voice_output[lVar25] = (INT16)uVar27;
      lVar25 = lVar25 + 1;
      lVar31 = lVar31 + 0x10;
    } while (lVar25 != 0x10);
    iVar5 = chip->state_counter;
    uVar27 = iVar5 % 3 + 0x10;
    if ((uVar19 >> (uVar27 & 0x1f) & 1) == 0) {
      iVar16 = iVar5 % 3;
      if (iVar5 + 2U < 5) {
        if (chip->adpcm[iVar16].cur_addr == chip->adpcm[iVar16].end_addr) {
          chip->adpcm[iVar16].cur_vol = 0;
        }
        if (chip->adpcm[iVar16].flag != 0) {
          chip->voice_output[uVar27] = 0;
          chip->adpcm[iVar16].flag = 0;
          chip->adpcm[iVar16].step_size = 10;
          UVar6 = chip->adpcm[iVar16].start_addr;
          chip->adpcm[iVar16].cur_vol = chip->adpcm[iVar16].volume;
          chip->adpcm[iVar16].cur_addr = UVar6;
        }
        uVar15 = chip->adpcm[iVar16].bank;
        UVar14 = '\0';
        if (((short)uVar15 < 0 && chip->romMask != 0) &&
           (uVar19 = chip->romMask &
                     ((uVar15 & 0x7fff) << 0x10 | (uint)chip->adpcm[iVar16].cur_addr), UVar14 = '\0'
           , uVar19 < chip->romSize)) {
          UVar14 = chip->romData[uVar19];
        }
      }
      else {
        uVar15 = chip->adpcm[iVar16].bank;
        uVar4 = chip->adpcm[iVar16].cur_addr;
        chip->adpcm[iVar16].cur_addr = uVar4 + 1;
        UVar14 = '\0';
        if (((short)uVar15 < 0 && chip->romMask != 0) &&
           (uVar19 = chip->romMask & ((uVar15 & 0x7fff) << 0x10 | (uint)uVar4), UVar14 = '\0',
           uVar19 < chip->romSize)) {
          UVar14 = chip->romData[uVar19] << 4;
        }
      }
      iVar21 = (int)(char)UVar14 >> 4;
      uVar19 = iVar21 * -2;
      if (iVar21 * -2 < 0) {
        uVar19 = iVar21 * 2;
      }
      iVar20 = (int)chip->adpcm[iVar16].step_size;
      iVar23 = (int)((uVar19 | 1) * iVar20) >> 1;
      iVar24 = -iVar23;
      if (0 < iVar21) {
        iVar24 = iVar23;
      }
      iVar24 = chip->voice_output[uVar27] + iVar24;
      iVar23 = -0x8000;
      if (-0x8000 < iVar24) {
        iVar23 = iVar24;
      }
      if (0x7ffe < iVar23) {
        iVar23 = 0x7fff;
      }
      chip->voice_output[uVar27] = (INT16)((uint)(chip->adpcm[iVar16].cur_vol * iVar23) >> 0x10);
      sVar11 = (short)((uint)(adpcm_step_table[iVar21 + 8] * iVar20) >> 6);
      sVar8 = 1;
      if (0 < sVar11) {
        sVar8 = sVar11;
      }
      sVar12 = 2000;
      if (sVar11 < 0x7d1) {
        sVar12 = sVar8;
      }
      chip->adpcm[iVar16].step_size = sVar12;
    }
    else {
      chip->voice_output[uVar27] = 0;
    }
    sVar8 = (chip->echo).delay_pos;
    sVar11 = (chip->echo).delay_line[sVar8];
    sVar12 = (chip->echo).last_sample;
    (chip->echo).last_sample = sVar11;
    iVar16 = (int)sVar12 + (int)sVar11 >> 1;
    (chip->echo).delay_pos = sVar8 + 1;
    (chip->echo).delay_line[sVar8] =
         (INT16)((uint)(iVar7 + (chip->echo).feedback * iVar16 * 4) >> 0x10);
    if ((chip->echo).length <= (chip->echo).delay_pos) {
      (chip->echo).delay_pos = 0;
    }
    uVar19 = iVar16 << 0xe;
    pIVar28 = chip->filter[0].taps;
    pIVar30 = chip->alt_filter[0].taps;
    lVar31 = 0;
    do {
      uVar27 = 0;
      if (lVar31 == 1) {
        uVar27 = uVar19;
      }
      uVar29 = 0;
      if (lVar31 == 0) {
        uVar29 = uVar19;
      }
      lVar25 = -0x26;
      do {
        uVar15 = *(short *)((long)chip->voice_output + lVar25) - 0x110;
        if (0x60 < uVar15) {
          uVar15 = 0x61;
        }
        iVar7 = (int)*(short *)((long)(chip->echo).delay_line + lVar25 + -8);
        uVar29 = uVar29 - chip->pan_tables[lVar31][0][uVar15] * iVar7;
        uVar27 = uVar27 - chip->pan_tables[lVar31][1][uVar15] * iVar7;
        lVar25 = lVar25 + 2;
      } while (lVar25 != 0);
      if ((int)uVar29 < -0x1ffffffe) {
        uVar29 = 0xe0000001;
      }
      if (0x1ffffffe < (int)uVar29) {
        uVar29 = 0x1fffffff;
      }
      if ((int)uVar27 < -0x1ffffffe) {
        uVar27 = 0xe0000001;
      }
      if (0x1ffffffe < (int)uVar27) {
        uVar27 = 0x1fffffff;
      }
      iVar7 = chip->filter[lVar31].tap_count;
      uVar1 = iVar7 - 1;
      if (iVar7 < 2) {
        iVar7 = 0;
        uVar18 = 0;
      }
      else {
        iVar16 = chip->filter[lVar31].delay_pos;
        uVar18 = (ulong)uVar1;
        uVar26 = 0;
        iVar7 = 0;
        do {
          iVar21 = iVar16 + 1;
          iVar7 = iVar7 + (int)chip->filter[lVar31].delay_line[iVar16] * (int)pIVar28[uVar26] * -4;
          iVar16 = iVar21;
          if ((int)uVar1 <= iVar21) {
            iVar16 = 0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar18 != uVar26);
        chip->filter[lVar31].delay_pos = iVar16;
      }
      sVar8 = chip->filter[lVar31].taps[uVar18];
      iVar16 = chip->filter[lVar31].delay_pos;
      iVar21 = iVar16 + 1;
      chip->filter[lVar31].delay_pos = iVar21;
      sVar11 = (short)(uVar27 >> 0xe);
      chip->filter[lVar31].delay_line[iVar16] = sVar11;
      if ((int)uVar1 <= iVar21) {
        chip->filter[lVar31].delay_pos = 0;
      }
      if (chip->state == 0x6b2) {
        iVar16 = chip->alt_filter[lVar31].tap_count;
        uVar27 = iVar16 - 1;
        if (iVar16 < 2) {
          iVar16 = 0;
          uVar18 = 0;
        }
        else {
          iVar21 = chip->alt_filter[lVar31].delay_pos;
          uVar18 = (ulong)uVar27;
          uVar26 = 0;
          iVar16 = 0;
          do {
            iVar24 = iVar21 + 1;
            iVar16 = iVar16 + (int)chip->alt_filter[lVar31].delay_line[iVar21] *
                              (int)pIVar30[uVar26] * -4;
            iVar21 = iVar24;
            if ((int)uVar27 <= iVar24) {
              iVar21 = 0;
            }
            uVar26 = uVar26 + 1;
          } while (uVar18 != uVar26);
          chip->alt_filter[lVar31].delay_pos = iVar21;
        }
        sVar12 = chip->alt_filter[lVar31].taps[uVar18];
        iVar21 = chip->alt_filter[lVar31].delay_pos;
        iVar24 = iVar21 + 1;
        chip->alt_filter[lVar31].delay_pos = iVar24;
        sVar13 = (short)(uVar29 >> 0xe);
        chip->alt_filter[lVar31].delay_line[iVar21] = sVar13;
        if ((int)uVar27 <= iVar24) {
          chip->alt_filter[lVar31].delay_pos = 0;
        }
        IVar9 = (INT16)((uint)(iVar16 + (int)sVar13 * (int)sVar12 * -4) >> 0x10);
      }
      else {
        IVar9 = (INT16)((uVar29 << 2) >> 0x10);
      }
      pqVar2 = chip->wet + lVar31;
      sVar12 = chip->wet[lVar31].write_pos;
      chip->wet[lVar31].write_pos = sVar12 + 1;
      pqVar2->delay_line[sVar12] = (INT16)((uint)(iVar7 + (int)sVar11 * (int)sVar8 * -4) >> 0x10);
      if (0x32 < chip->wet[lVar31].write_pos) {
        pqVar2->write_pos = 0;
      }
      sVar8 = pqVar2->read_pos;
      IVar22 = sVar8 + 1;
      pqVar2->read_pos = IVar22;
      sVar8 = pqVar2->delay_line[sVar8];
      sVar11 = pqVar2->volume;
      if (0x32 < IVar22) {
        IVar22 = 0;
      }
      pqVar2->read_pos = IVar22;
      pqVar3 = chip->dry + lVar31;
      sVar12 = chip->dry[lVar31].write_pos;
      chip->dry[lVar31].write_pos = sVar12 + 1;
      pqVar3->delay_line[sVar12] = IVar9;
      if (0x32 < chip->dry[lVar31].write_pos) {
        pqVar3->write_pos = 0;
      }
      sVar12 = pqVar3->read_pos;
      sVar13 = sVar12 + 1;
      pqVar3->read_pos = sVar13;
      if (0x32 < sVar13) {
        sVar13 = 0;
      }
      iVar7 = (int)sVar11 * (int)sVar8 + (int)pqVar3->volume * (int)pqVar3->delay_line[sVar12] +
              0x2000 >> 0xe;
      if (iVar7 < -0x7ffe) {
        iVar7 = -0x7fff;
      }
      IVar9 = (INT16)iVar7;
      if (0x7ffe < iVar7) {
        IVar9 = 0x7fff;
      }
      pqVar3->read_pos = sVar13;
      chip->out[lVar31] = IVar9;
      if (chip->delay_update != 0) {
        iVar7 = (int)pqVar2->write_pos - (int)pqVar2->delay;
        sVar8 = (short)iVar7 + 0x33 + (short)(iVar7 / 0x33) * -0x33;
        if (-1 < iVar7 % 0x33) {
          sVar8 = (short)(iVar7 % 0x33);
        }
        pqVar2->read_pos = sVar8;
        iVar7 = (int)pqVar3->write_pos - (int)pqVar3->delay;
        sVar8 = (short)iVar7 + 0x33 + (short)(iVar7 / 0x33) * -0x33;
        if (-1 < iVar7 % 0x33) {
          sVar8 = (short)(iVar7 % 0x33);
        }
        pqVar3->read_pos = sVar8;
      }
      pIVar28 = pIVar28 + 0xc4;
      pIVar30 = pIVar30 + 0xc4;
      bVar32 = lVar31 == 0;
      lVar31 = lVar31 + 1;
    } while (bVar32);
    chip->delay_update = 0;
    chip->state_counter = iVar5 + 1;
    if (iVar5 < 5) {
      return;
    }
    goto LAB_0016aa3a;
  }
  if (chip->state_counter < 2) {
    if (chip->state_counter == 1) {
      chip->state_counter = 2;
      return;
    }
    memset(chip->voice,0,0x130);
    memset(&chip->echo,0,0xfe2);
    lVar31 = -0x26;
    do {
      *(undefined2 *)((long)chip->voice_output + lVar31) = 0x120;
      *(undefined2 *)((long)(chip->echo).delay_line + lVar31 + -8) = 0;
      lVar31 = lVar31 + 2;
    } while (lVar31 != 0);
    lVar31 = 0;
    do {
      *(undefined2 *)((long)&chip->voice[0].bank + lVar31) = 0x8000;
      lVar31 = lVar31 + 0x10;
    } while (lVar31 != 0x100);
    lVar31 = 0;
    do {
      *(undefined2 *)((long)&chip->adpcm[0].bank + lVar31) = 0x8000;
      lVar31 = lVar31 + 0x10;
    } while (lVar31 != 0x30);
    if (uVar15 == 0x61a) {
      chip->wet[0].delay = 1;
      chip->dry[0].delay = 0;
      chip->wet[1].delay = 0;
      chip->dry[1].delay = 0;
      chip->filter[0].table_pos = 0xf73;
      chip->filter[1].table_pos = 0xfa4;
      chip->alt_filter[0].table_pos = 0xf73;
      chip->alt_filter[1].table_pos = 0xfa4;
      UVar6 = 0x4f;
      UVar10 = 0x542;
    }
    else {
      chip->wet[0].delay = 0;
      chip->dry[0].delay = 0x2e;
      chip->wet[1].delay = 0;
      chip->dry[1].delay = 0x30;
      chip->filter[0].table_pos = 0xdb2;
      chip->filter[1].table_pos = 0xe11;
      UVar6 = 0x39;
      UVar10 = 0x55a;
    }
    (chip->echo).end_pos = UVar10;
    chip->next_state = UVar6;
    chip->wet[0].volume = 0x3fff;
    chip->dry[0].volume = 0x3fff;
    chip->wet[1].volume = 0x3fff;
    chip->dry[1].volume = 0x3fff;
    chip->delay_update = 1;
    chip->ready_flag = '\0';
    chip->state_counter = 1;
    return;
  }
LAB_0016aa3a:
  chip->state_counter = 0;
  chip->state = chip->next_state;
  return;
}

Assistant:

static void update_sample(struct qsound_chip *chip)
{
	switch(chip->state)
	{
		default:
		case STATE_INIT1:
		case STATE_INIT2:
			state_init(chip);
			return;
		case STATE_REFRESH1:
			state_refresh_filter_1(chip);
			return;
		case STATE_REFRESH2:
			state_refresh_filter_2(chip);
			return;
		case STATE_NORMAL1:
		case STATE_NORMAL2:
			state_normal_update(chip);
			return;
	}
}